

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeVMOVRRS(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  uint16_t *Decoder_00;
  uint64_t Address_00;
  
  uVar1 = (Insn >> 5 & 1) + (Insn & 0xf) * 2;
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[Insn >> 0xc & 0xf]);
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[Insn >> 0x10 & 0xf]);
  MCOperand_CreateReg0(Inst,(uint)SPRDecoderTable[uVar1]);
  if (uVar1 != 0x1f) {
    Decoder_00 = SPRDecoderTable;
    MCOperand_CreateReg0(Inst,(uint)SPRDecoderTable[(ulong)uVar1 + 1]);
    DVar2 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_00,Decoder_00);
    DVar2 = (*(code *)(&DAT_001cdf70 + *(int *)(&DAT_001cdf70 + (ulong)DVar2 * 4)))();
    return DVar2;
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeVMOVRRS(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rt  = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rt2 = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm  = fieldFromInstruction_4(Insn,  5, 1);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	Rm |= fieldFromInstruction_4(Insn, 0, 4) << 1;

	if (Rt == 0xF || Rt2 == 0xF || Rm == 0x1F)
		S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt  , Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt2 , Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeSPRRegisterClass(Inst, Rm  , Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeSPRRegisterClass(Inst, Rm+1, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}